

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O3

void Abc_SclTransferGates(Abc_Ntk_t *pOld,Abc_Ntk_t *pNew)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  
  if (pOld->nBarBufs2 < 1) {
    __assert_fail("pOld->nBarBufs2 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                  ,0x69,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->nBarBufs2 == 0) {
    pVVar4 = pOld->vObjs;
    if (0 < pVVar4->nSize) {
      lVar3 = 0;
      do {
        plVar1 = (long *)pVVar4->pArray[lVar3];
        if ((((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
            ((*(int *)(*plVar1 + 4) != 4 ||
             ((*(int *)((long)plVar1 + 0x1c) != 1 || (plVar1[7] != 0)))))) &&
           (plVar2 = (long *)plVar1[8], plVar2 != (long *)0x0)) {
          if ((Abc_Ntk_t *)*plVar2 != pNew) {
            __assert_fail("Abc_ObjNtk(pObj->pCopy) == pNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                          ,0x6f,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
          }
          plVar1[7] = plVar2[7];
          pVVar4 = pOld->vObjs;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar4->nSize);
    }
    return;
  }
  __assert_fail("pNew->nBarBufs2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUtil.c"
                ,0x6a,"void Abc_SclTransferGates(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_SclTransferGates( Abc_Ntk_t * pOld, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj; int i;
    assert( pOld->nBarBufs2 > 0 );
    assert( pNew->nBarBufs2 == 0 );
    Abc_NtkForEachNodeNotBarBuf( pOld, pObj, i )
    {
        if ( pObj->pCopy == NULL )
            continue;
        assert( Abc_ObjNtk(pObj->pCopy) == pNew );
        pObj->pData = pObj->pCopy->pData;
    }
}